

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

float __thiscall
Imath_3_2::Matrix44<float>::fastMinor
          (Matrix44<float> *this,int r0,int r1,int r2,int c0,int c1,int c2)

{
  int c1_local;
  int c0_local;
  int r2_local;
  int r1_local;
  int r0_local;
  Matrix44<float> *this_local;
  
  return this->x[r0][c2] *
         (this->x[r1][c0] * this->x[r2][c1] + -(this->x[r1][c1] * this->x[r2][c0])) +
         this->x[r0][c0] *
         (this->x[r1][c1] * this->x[r2][c2] + -(this->x[r1][c2] * this->x[r2][c1])) +
         this->x[r0][c1] *
         (this->x[r1][c2] * this->x[r2][c0] + -(this->x[r1][c0] * this->x[r2][c2]));
}

Assistant:

IMATH_HOSTDEVICE constexpr inline T
Matrix44<T>::fastMinor (
    const int r0,
    const int r1,
    const int r2,
    const int c0,
    const int c1,
    const int c2) const IMATH_NOEXCEPT
{
    return x[r0][c0] * (x[r1][c1] * x[r2][c2] - x[r1][c2] * x[r2][c1]) +
           x[r0][c1] * (x[r1][c2] * x[r2][c0] - x[r1][c0] * x[r2][c2]) +
           x[r0][c2] * (x[r1][c0] * x[r2][c1] - x[r1][c1] * x[r2][c0]);
}